

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generator.cc
# Opt level: O2

pair<bool,_bool> __thiscall
kratos::Generator::correct_wire_direction
          (Generator *this,shared_ptr<kratos::Var> *var1,shared_ptr<kratos::Var> *var2)

{
  VarType VVar1;
  VarType VVar2;
  Generator *pGVar3;
  bool bVar4;
  pair<bool,_bool> pVar5;
  int iVar6;
  long lVar7;
  Port *pPVar8;
  Port *port2;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  UserException *this_00;
  undefined4 extraout_var_05;
  VarException *pVVar9;
  undefined4 extraout_var_06;
  PortDirection PVar10;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_2
  in_R9;
  InterfacePort *port_i;
  element_type *peVar11;
  element_type *peVar12;
  ushort uVar13;
  Port *port1;
  basic_string_view<char> bVar14;
  string_view format_str;
  string_view format_str_00;
  format_args args;
  format_args args_00;
  initializer_list<const_kratos::IRNode_*> __l;
  initializer_list<const_kratos::IRNode_*> __l_00;
  size_type local_c8;
  undefined8 uStack_c0;
  string local_a8;
  Port *local_88;
  shared_ptr<kratos::Var> *local_80;
  string local_78;
  pointer local_58;
  size_type sStack_50;
  Generator *local_40;
  allocator_type local_31;
  
  peVar12 = (var1->super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  local_80 = var1;
  local_40 = this;
  if ((peVar12 != (element_type *)0x0) &&
     (peVar11 = (var2->super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>)._M_ptr,
     peVar11 != (element_type *)0x0)) {
    while (VVar1 = peVar12->type_, VVar1 == Slice) {
      lVar7 = __dynamic_cast(peVar12,&Var::typeinfo,&VarSlice::typeinfo,0);
      peVar12 = *(element_type **)(lVar7 + 0x270);
    }
    while (VVar2 = peVar11->type_, VVar2 == Slice) {
      lVar7 = __dynamic_cast(peVar11,&Var::typeinfo,&VarSlice::typeinfo,0);
      peVar11 = *(element_type **)(lVar7 + 0x270);
    }
    if (VVar1 == PortIO) {
      pPVar8 = (Port *)__dynamic_cast(peVar12,&Var::typeinfo,&Port::typeinfo,0);
      if (VVar2 == PortIO) {
        port2 = (Port *)__dynamic_cast(peVar11,&Var::typeinfo,&Port::typeinfo,0);
        pVar5 = correct_port_direction(pPVar8,port2,local_40);
        uVar13 = (ushort)pVar5 & 0xff00;
      }
      else {
        iVar6 = (*(pPVar8->super_Var).super_IRNode._vptr_IRNode[0xd])(pPVar8);
        pGVar3 = local_40;
        if ((Generator *)CONCAT44(extraout_var_01,iVar6) == local_40) {
          iVar6 = (*(pPVar8->super_Var).super_IRNode._vptr_IRNode[0x1d])(pPVar8);
          PVar10 = Out;
          if (((char)iVar6 != '\0') &&
             ((*(char *)(pPVar8[1].super_Var.super_IRNode._vptr_IRNode + 0x10) != '\x01' ||
              (iVar6 = (*(peVar11->super_IRNode)._vptr_IRNode[0xd])(peVar11),
              (Generator *)CONCAT44(extraout_var_04,iVar6) != pGVar3)))) {
            PVar10 = In;
          }
          bVar4 = pPVar8->direction_ == PVar10;
        }
        else {
          iVar6 = (*(pPVar8->super_Var).super_IRNode._vptr_IRNode[0xd])(pPVar8);
          std::__shared_ptr<kratos::Generator,(__gnu_cxx::_Lock_policy)2>::
          __shared_ptr<kratos::Generator,void>
                    ((__shared_ptr<kratos::Generator,(__gnu_cxx::_Lock_policy)2> *)&local_78,
                     (__weak_ptr<kratos::Generator,_(__gnu_cxx::_Lock_policy)2> *)
                     (CONCAT44(extraout_var_02,iVar6) + 0x68));
          bVar4 = has_child_generator(pGVar3,(shared_ptr<kratos::Generator> *)&local_78);
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                    ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_78._M_string_length);
          if (!bVar4) {
            pVVar9 = (VarException *)__cxa_allocate_exception(0x10);
            iVar6 = (*(pPVar8->super_Var).super_IRNode._vptr_IRNode[0xd])(pPVar8);
            (*(((local_80->super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
              super_IRNode)._vptr_IRNode[0x1f])(&local_c8);
            local_78._M_dataplus._M_p = *(pointer *)(CONCAT44(extraout_var_06,iVar6) + 0x78);
            local_78._M_string_length = *(size_type *)(CONCAT44(extraout_var_06,iVar6) + 0x80);
            local_58 = (local_40->name)._M_dataplus._M_p;
            sStack_50 = (local_40->name)._M_string_length;
            local_78.field_2._M_allocated_capacity = local_c8;
            local_78.field_2._8_8_ = uStack_c0;
            bVar14 = fmt::v7::to_string_view<char,_0>("{0}.{1} is not part of {2}");
            format_str_00.data_ = (char *)bVar14.size_;
            format_str_00.size_ = 0xddd;
            args_00.
            super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
            .field_1.args_ = in_R9.args_;
            args_00.
            super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
            .desc_ = (unsigned_long_long)&local_78;
            fmt::v7::detail::vformat_abi_cxx11_
                      (&local_a8,(detail *)bVar14.data_,format_str_00,args_00);
            __l_00._M_len = 1;
            __l_00._M_array = (iterator)&local_88;
            local_88 = pPVar8;
            std::vector<const_kratos::IRNode_*,_std::allocator<const_kratos::IRNode_*>_>::vector
                      ((vector<const_kratos::IRNode_*,_std::allocator<const_kratos::IRNode_*>_> *)
                       &local_78,__l_00,&local_31);
            VarException::VarException
                      (pVVar9,&local_a8,
                       (vector<const_kratos::IRNode_*,_std::allocator<const_kratos::IRNode_*>_> *)
                       &local_78);
            __cxa_throw(pVVar9,&VarException::typeinfo,std::runtime_error::~runtime_error);
          }
          bVar4 = pPVar8->direction_ == In;
        }
        pVar5.second = false;
        pVar5.first = bVar4;
        uVar13 = 0x100;
      }
    }
    else {
      uVar13 = 0x100;
      pVar5.first = true;
      pVar5.second = false;
      if (VVar2 == PortIO) {
        PVar10 = In;
        pPVar8 = (Port *)__dynamic_cast(peVar11,&Var::typeinfo,&Port::typeinfo,0);
        iVar6 = (*(pPVar8->super_Var).super_IRNode._vptr_IRNode[0xd])(pPVar8);
        pGVar3 = local_40;
        if ((Generator *)CONCAT44(extraout_var,iVar6) == local_40) {
          iVar6 = (*(pPVar8->super_Var).super_IRNode._vptr_IRNode[0x1d])(pPVar8);
          if (((char)iVar6 != '\0') &&
             ((*(char *)(pPVar8[1].super_Var.super_IRNode._vptr_IRNode + 0x10) != '\x01' ||
              (iVar6 = (*(peVar12->super_IRNode)._vptr_IRNode[0xd])(peVar12),
              (Generator *)CONCAT44(extraout_var_03,iVar6) != pGVar3)))) {
            PVar10 = Out;
          }
          bVar4 = pPVar8->direction_ == PVar10;
        }
        else {
          iVar6 = (*(pPVar8->super_Var).super_IRNode._vptr_IRNode[0xd])(pPVar8);
          std::__shared_ptr<kratos::Generator,(__gnu_cxx::_Lock_policy)2>::
          __shared_ptr<kratos::Generator,void>
                    ((__shared_ptr<kratos::Generator,(__gnu_cxx::_Lock_policy)2> *)&local_78,
                     (__weak_ptr<kratos::Generator,_(__gnu_cxx::_Lock_policy)2> *)
                     (CONCAT44(extraout_var_00,iVar6) + 0x68));
          bVar4 = has_child_generator(pGVar3,(shared_ptr<kratos::Generator> *)&local_78);
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                    ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_78._M_string_length);
          if (!bVar4) {
            pVVar9 = (VarException *)__cxa_allocate_exception(0x10);
            iVar6 = (*(pPVar8->super_Var).super_IRNode._vptr_IRNode[0xd])(pPVar8);
            (*(((local_80->super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
              super_IRNode)._vptr_IRNode[0x1f])(&local_c8);
            local_78._M_dataplus._M_p = *(pointer *)(CONCAT44(extraout_var_05,iVar6) + 0x78);
            local_78._M_string_length = *(size_type *)(CONCAT44(extraout_var_05,iVar6) + 0x80);
            local_58 = (local_40->name)._M_dataplus._M_p;
            sStack_50 = (local_40->name)._M_string_length;
            local_78.field_2._M_allocated_capacity = local_c8;
            local_78.field_2._8_8_ = uStack_c0;
            bVar14 = fmt::v7::to_string_view<char,_0>("{0}.{1} is not part of {2}");
            format_str.data_ = (char *)bVar14.size_;
            format_str.size_ = 0xddd;
            args.
            super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
            .field_1.args_ = in_R9.args_;
            args.
            super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
            .desc_ = (unsigned_long_long)&local_78;
            fmt::v7::detail::vformat_abi_cxx11_(&local_a8,(detail *)bVar14.data_,format_str,args);
            __l._M_len = 1;
            __l._M_array = (iterator)&local_88;
            local_88 = pPVar8;
            std::vector<const_kratos::IRNode_*,_std::allocator<const_kratos::IRNode_*>_>::vector
                      ((vector<const_kratos::IRNode_*,_std::allocator<const_kratos::IRNode_*>_> *)
                       &local_78,__l,&local_31);
            VarException::VarException
                      (pVVar9,&local_a8,
                       (vector<const_kratos::IRNode_*,_std::allocator<const_kratos::IRNode_*>_> *)
                       &local_78);
            __cxa_throw(pVVar9,&VarException::typeinfo,std::runtime_error::~runtime_error);
          }
          bVar4 = pPVar8->direction_ == Out;
        }
        pVar5.second = false;
        pVar5.first = bVar4;
      }
    }
    return (pair<bool,_bool>)(uVar13 | (ushort)pVar5 & 0xff);
  }
  this_00 = (UserException *)__cxa_allocate_exception(0x10);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_78,"Variable cannot be null (None)",(allocator<char> *)&local_a8);
  UserException::UserException(this_00,&local_78);
  __cxa_throw(this_00,&UserException::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

std::pair<bool, bool> Generator::correct_wire_direction(const std::shared_ptr<Var> &var1,
                                                        const std::shared_ptr<Var> &var2) {
    if (!var1 || !var2) throw UserException("Variable cannot be null (None)");
    Var *root1 = var1.get();
    while (root1->type() == VarType::Slice) {
        auto *var = dynamic_cast<VarSlice *>(root1);
        root1 = var->parent_var;
    }
    Var *root2 = var2.get();
    while (root2->type() == VarType::Slice) {
        auto *var = dynamic_cast<VarSlice *>(root2);
        root2 = var->parent_var;
    }
    if (root1->type() != VarType::PortIO && root2->type() != VarType::PortIO) {
        // there is nothing we can do
        return {true, true};
    } else if (root1->type() == VarType::PortIO && root2->type() != VarType::PortIO) {
        // var1 is port and var2 is not
        auto *port1 = dynamic_cast<Port *>(root1);
        if (port1->generator() == this) {
            bool flip_dir = false;
            if (port1->is_interface()) {
                auto *port_i = reinterpret_cast<InterfacePort *>(port1);
                const auto *ref = port_i->interface();
                flip_dir = !(ref->is_port() && root2->generator() == this);
            }
            return {!flip_dir ? port1->port_direction() == PortDirection::Out
                              : port1->port_direction() == PortDirection::In,
                    true};
        } else {
            if (!has_child_generator(port1->generator()->shared_from_this())) {
                throw VarException(::format("{0}.{1} is not part of {2}", port1->generator()->name,
                                            var1->to_string(), name),
                                   {port1});
            }
            // child generator, reverse order
            return {port1->port_direction() == PortDirection::In, true};
        }
    } else if (root2->type() == VarType::PortIO && root1->type() != VarType::PortIO) {
        // var2 is port and var1 is not
        auto *port2 = dynamic_cast<Port *>(root2);
        if (port2->generator() == this) {
            bool flip_dir = false;
            if (port2->is_interface()) {
                auto *port_i = reinterpret_cast<InterfacePort *>(port2);
                const auto *ref = port_i->interface();
                flip_dir = !(ref->is_port() && root1->generator() == this);
            }
            return {!flip_dir ? port2->port_direction() == PortDirection::In
                              : port2->port_direction() == PortDirection::Out,
                    true};
        } else {
            if (!has_child_generator(port2->generator()->shared_from_this())) {
                throw VarException(::format("{0}.{1} is not part of {2}", port2->generator()->name,
                                            var1->to_string(), name),
                                   {port2});
            }
            // child generator, reverse order
            return {port2->port_direction() == PortDirection::Out, true};
        }
    } else {
        // both are ports
        auto *port1 = dynamic_cast<Port *>(root1);
        auto *port2 = dynamic_cast<Port *>(root2);
        return correct_port_direction(port1, port2, this);
    }
}